

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76496.c
# Opt level: O2

void sn76496_w_mame(void *chip,UINT8 reg,UINT8 data)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ushort uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  
  iVar3 = (int)CONCAT71(in_register_00000031,reg);
  if (iVar3 == 1) {
    if (*(char *)((long)chip + 0x39) != '\0') {
      *(UINT8 *)((long)chip + 0xac) = data;
      return;
    }
  }
  else if (iVar3 == 0) {
    *(undefined4 *)((long)chip + 0xd4) = 1;
    uVar1 = (uint)data;
    if ((char)data < '\0') {
      bVar4 = data >> 4 & 7;
      *(byte *)((long)chip + 0x94) = bVar4;
      if (((bVar4 == 6) && (*(char *)((long)chip + 0x40) != '\0')) &&
         ((uVar1 & 4) != (*(ushort *)((long)chip + 0x90) & 4))) {
        *(undefined4 *)((long)chip + 0xa8) = *(undefined4 *)((long)chip + 0x2c);
      }
      *(ushort *)((long)chip + (ulong)bVar4 * 2 + 0x84) =
           (ushort)(data & 0xf) | *(ushort *)((long)chip + (ulong)bVar4 * 2 + 0x84) & 0x3f0;
    }
    else {
      bVar4 = *(byte *)((long)chip + 0x94);
    }
    if (bVar4 < 8) {
      uVar6 = (ulong)bVar4;
      if ((0xaaU >> (bVar4 & 0x1f) & 1) == 0) {
        if ((0x15U >> (bVar4 & 0x1f) & 1) == 0) {
          if ((char)data < '\0') {
            uVar5 = *(ushort *)((long)chip + 0x90);
          }
          else {
            uVar5 = (ushort)(data & 0xf) | *(ushort *)((long)chip + 0x90) & 0x3f0;
            *(ushort *)((long)chip + 0x90) = uVar5;
          }
          if ((uVar5 & 3) == 3) {
            iVar3 = *(int *)((long)chip + 0xb8) * 2;
          }
          else {
            iVar3 = 2 << ((byte)(uVar5 & 3) | 4);
          }
          *(int *)((long)chip + 0xbc) = iVar3;
          if (*(char *)((long)chip + 0x40) == '\0') {
            *(undefined4 *)((long)chip + 0xa8) = *(undefined4 *)((long)chip + 0x2c);
            return;
          }
        }
        else {
          uVar5 = *(ushort *)((long)chip + uVar6 * 2 + 0x84);
          uVar2 = (uint)uVar5;
          if (-1 < (char)data) {
            uVar2 = (uVar1 & 0x3f) << 4 | uVar5 & 0xf;
            *(short *)((long)chip + uVar6 * 2 + 0x84) = (short)uVar2;
          }
          if (((short)uVar2 == 0) && (*(char *)((long)chip + 0x41) == '\0')) {
            uVar2 = 0x400;
          }
          *(uint *)((long)chip + (ulong)(bVar4 >> 1) * 4 + 0xb0) = uVar2;
          if ((bVar4 == 4) && ((~*(uint *)((long)chip + 0x90) & 3) == 0)) {
            *(int *)((long)chip + 0xbc) = *(int *)((long)chip + 0xb8) * 2;
            return;
          }
        }
      }
      else {
        *(undefined4 *)((long)chip + (ulong)(bVar4 >> 1) * 4 + 0x98) =
             *(undefined4 *)((long)chip + (ulong)(uVar1 & 0xf) * 4 + 0x44);
        if (-1 < (char)data) {
          *(ushort *)((long)chip + uVar6 * 2 + 0x84) =
               *(ushort *)((long)chip + uVar6 * 2 + 0x84) & 0x3f0 | (ushort)(uVar1 & 0xf);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void sn76496_w_mame(void *chip, UINT8 reg, UINT8 data)
{
	switch(reg)
	{
	case SN76496_W_REG:
		sn76496_write_reg(chip, 0x00, data);
		break;
	case SN76496_W_GGST:
		sn76496_stereo_w(chip, 0x00, data);
		break;
	}
	return;
}